

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QWindow * __thiscall QWidgetPrivate::windowHandle(QWidgetPrivate *this,WindowHandleMode mode)

{
  QWExtra *pQVar1;
  _Head_base<0UL,_QTLWExtra_*,_false> in_RAX;
  long lVar2;
  QTLWExtra *pQVar3;
  long lVar4;
  bool bVar5;
  
  if (Closest < mode) goto LAB_002f83bc;
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar1 == (QWExtra *)0x0) {
    in_RAX._M_head_impl = (QTLWExtra *)0x0;
  }
  else {
    in_RAX._M_head_impl =
         *(QTLWExtra **)
          &(pQVar1->topextra)._M_t.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
    ;
  }
  if ((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)in_RAX._M_head_impl ==
      (QTLWExtra *)0x0) {
LAB_002f83b2:
    bVar5 = true;
  }
  else {
    bVar5 = false;
    in_RAX._M_head_impl = *(QTLWExtra **)((long)in_RAX._M_head_impl + 0x20);
    if ((mode != Direct) && (in_RAX._M_head_impl == (QTLWExtra *)0x0)) goto LAB_002f83b2;
  }
  if (!bVar5) {
    return (QWindow *)in_RAX._M_head_impl;
  }
LAB_002f83bc:
  if (mode == Closest) {
    lVar2 = *(long *)&this->field_0x8;
    do {
      lVar2 = *(long *)(*(long *)(lVar2 + 8) + 0x10);
      bVar5 = true;
      if (lVar2 == 0) goto LAB_002f840f;
    } while (**(long **)(lVar2 + 0x20) == 0);
    if (lVar2 != 0) {
      lVar2 = *(long *)(*(long *)(lVar2 + 8) + 0x78);
      if (lVar2 == 0) {
        lVar2 = 0;
      }
      else {
        lVar2 = *(long *)(lVar2 + 8);
      }
      if (lVar2 == 0) {
        pQVar3 = (QTLWExtra *)0x0;
      }
      else {
        pQVar3 = *(QTLWExtra **)(lVar2 + 0x20);
      }
      bVar5 = pQVar3 == (QTLWExtra *)0x0;
      if (!bVar5) {
        in_RAX._M_head_impl = pQVar3;
      }
    }
LAB_002f840f:
    if (!bVar5) {
      return (QWindow *)in_RAX._M_head_impl;
    }
  }
  if (mode - Closest < 2) {
    lVar2 = *(long *)&this->field_0x8;
    do {
      lVar4 = lVar2;
      lVar2 = *(long *)(*(long *)(lVar4 + 8) + 0x10);
      if (lVar2 == 0) break;
    } while ((*(uint *)(*(long *)(lVar4 + 0x20) + 0xc) & 1) == 0);
    if (lVar4 == 0) {
      bVar5 = true;
    }
    else {
      lVar2 = *(long *)(*(long *)(lVar4 + 8) + 0x78);
      if (lVar2 == 0) {
        lVar2 = 0;
      }
      else {
        lVar2 = *(long *)(lVar2 + 8);
      }
      if (lVar2 == 0) {
        pQVar3 = (QTLWExtra *)0x0;
      }
      else {
        pQVar3 = *(QTLWExtra **)(lVar2 + 0x20);
      }
      bVar5 = pQVar3 == (QTLWExtra *)0x0;
      if (!bVar5) {
        in_RAX._M_head_impl = pQVar3;
      }
    }
    if (!bVar5) {
      return (QWindow *)in_RAX._M_head_impl;
    }
  }
  return (QWindow *)0x0;
}

Assistant:

QWindow *QWidgetPrivate::windowHandle(WindowHandleMode mode) const
{
    if (mode == WindowHandleMode::Direct || mode == WindowHandleMode::Closest) {
        if (QTLWExtra *x = maybeTopData()) {
            if (x->window != nullptr || mode == WindowHandleMode::Direct)
                return x->window;
        }
    }
    if (mode == WindowHandleMode::Closest) {
        // FIXME: Use closestParentWidgetWithWindowHandle instead
        if (auto nativeParent = q_func()->nativeParentWidget()) {
            if (auto window = nativeParent->windowHandle())
                return window;
        }
    }
    if (mode == WindowHandleMode::TopLevel || mode == WindowHandleMode::Closest) {
        if (auto topLevel = q_func()->topLevelWidget()) {
            if (auto window = topLevel ->windowHandle())
                return window;
        }
    }
    return nullptr;
}